

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveVecToPtr
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Vec *src,BaseReg *out)

{
  byte bVar1;
  long lVar2;
  BaseCompiler *this_00;
  BaseEmitter *this_01;
  Error EVar3;
  uint uVar4;
  undefined8 extraout_RAX;
  InstId instId;
  byte bVar5;
  uint32_t uVar6;
  Mem vecPtr;
  Vec vecReg;
  Mem stackPtr;
  Operand_ local_50;
  Operand_ local_40;
  Operand_ local_30;
  
  if ((arg->_data >> 8 & 1) != 0) {
    bVar1 = TypeUtils::_typeData[(ulong)(arg->_data & 0xff) + 0x100];
    if (bVar1 == 0) {
      EVar3 = 3;
    }
    else {
      bVar5 = 0x10;
      if (0x10 < bVar1) {
        bVar5 = bVar1;
      }
      uVar4 = (uint)bVar5;
      local_50._data[1] = -uVar4 & (uVar4 + *(int *)&invokeNode->field_0x108) - 1;
      lVar2 = *(long *)(this + 0x20);
      if (bVar5 < *(byte *)(lVar2 + 0x2db)) {
        bVar5 = *(byte *)(lVar2 + 0x2db);
      }
      *(byte *)(lVar2 + 0x2db) = bVar5;
      if (bVar5 < *(byte *)(lVar2 + 0x2dd)) {
        bVar5 = *(byte *)(lVar2 + 0x2dd);
      }
      *(byte *)(lVar2 + 0x2dd) = bVar5;
      *(uint *)&invokeNode->field_0x108 = uVar4 + local_50._data[1];
      uVar6 = 0x10000161;
      if (0x1f < bVar1) {
        uVar6 = 0x20000169;
      }
      local_40._signature._bits = 0x40000171;
      if (bVar1 < 0x40) {
        local_40._signature._bits = uVar6;
      }
      local_40._baseId = (src->super_Reg).super_BaseReg.super_Operand.super_Operand_._baseId;
      local_40._data[0] = 0;
      local_40._data[1] = 0;
      local_50._signature._bits = *(uint *)(*(long *)this + 0x1d8) & 0xf8 | 2;
      local_50._baseId = *(uint32_t *)(*(long *)this + 0x1dc);
      local_50._data[0] = 0;
      instId = 0x1ba;
      if (((byte)this[0x292] & 1) != 0) {
        instId = 0x4a9;
      }
      if (0x10 < bVar1) {
        instId = 0x4a9;
      }
      this_00 = *(BaseCompiler **)(this + 8);
      EVar3 = BaseCompiler::_newReg
                        (this_00,out,
                         *(TypeId *)
                          ((ulong)((this_00->super_BaseBuilder).super_BaseEmitter._gpSignature._bits
                                   >> 3 & 0x1f) +
                          (ulong)(this_00->super_BaseBuilder).super_BaseEmitter._environment._arch *
                          0xd8 + 0x14b094),(char *)0x0);
      if (EVar3 == 0) {
        this_01 = *(BaseEmitter **)(this + 8);
        uVar4 = (out->super_Operand).super_Operand_._baseId - 0x100;
        if (*(uint *)&this_01[3]._errorHandler <= uVar4) goto LAB_00147bea;
        *(undefined1 *)
         (*(long *)(&((this_01[3]._logger)->_options)._indentation + (ulong)uVar4 * 2 + -3) + 0xe) =
             0x50;
        EVar3 = BaseEmitter::_emitI(this_01,0x193,(Operand_ *)out,&local_50);
        if (EVar3 == 0) {
          local_30._signature._bits =
               (out->super_Operand).super_Operand_._signature._bits & 0xf8 | 2;
          local_30._baseId = (out->super_Operand).super_Operand_._baseId;
          local_30._data[0] = 0;
          local_30._data[1] = 0;
          EVar3 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),instId,&local_30,&local_40);
          if (EVar3 == 0) {
            if ((arg->_data >> 9 & 1) != 0) {
              local_30._signature._bits = *(uint *)(*(long *)this + 0x1d8) & 0xf8 | 2;
              local_30._baseId = *(uint32_t *)(*(long *)this + 0x1dc);
              local_30._data = (uint32_t  [2])((ulong)(uint)((int)arg->_data >> 0xc) << 0x20);
              EVar3 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x1b7,&local_30,
                                          (Operand_ *)out);
              if (EVar3 != 0) {
                return EVar3;
              }
            }
            EVar3 = 0;
          }
        }
      }
    }
    return EVar3;
  }
  moveVecToPtr();
LAB_00147bea:
  moveVecToPtr();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Error RACFGBuilder::moveVecToPtr(InvokeNode* invokeNode, const FuncValue& arg, const Vec& src, BaseReg* out) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isReg());

  uint32_t argSize = TypeUtils::sizeOf(arg.typeId());
  if (argSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (argSize < 16)
    argSize = 16;

  uint32_t argStackOffset = Support::alignUp(invokeNode->detail()._argStackSize, argSize);
  _funcNode->frame().updateCallStackAlignment(argSize);
  invokeNode->detail()._argStackSize = argStackOffset + argSize;

  Vec vecReg(x86VecRegSignatureBySize(argSize), src.id());
  Mem vecPtr = ptr(_pass->_sp.as<Gp>(), int32_t(argStackOffset));

  uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);
  if (argSize > 16)
    vMovInstId = Inst::kIdVmovaps;

  ASMJIT_PROPAGATE(cc()->_newReg(out, ArchTraits::byArch(cc()->arch()).regTypeToTypeId(cc()->_gpSignature.regType()), nullptr));

  VirtReg* vReg = cc()->virtRegById(out->id());
  vReg->setWeight(BaseRAPass::kCallArgWeight);

  ASMJIT_PROPAGATE(cc()->lea(out->as<Gp>(), vecPtr));
  ASMJIT_PROPAGATE(cc()->emit(vMovInstId, ptr(out->as<Gp>()), vecReg));

  if (arg.isStack()) {
    Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
    ASMJIT_PROPAGATE(cc()->mov(stackPtr, out->as<Gp>()));
  }

  return kErrorOk;
}